

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_rebels.cpp
# Opt level: O0

int AF_A_ShootGun(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *ent;
  DObject *this;
  int iVar1;
  bool bVar2;
  bool local_96;
  bool local_93;
  FName local_90;
  FName local_8c;
  TAngle<double> local_88;
  TAngle<double> local_80;
  TAngle<double> local_78;
  undefined1 local_70 [20];
  FSoundID local_5c;
  TAngle<double> local_58;
  DAngle pitch;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_rebels.cpp"
                  ,0x19,"int AF_A_ShootGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    ent = (AActor *)(param->field_0).field_1.a;
    local_93 = true;
    if (ent != (AActor *)0x0) {
      local_93 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
    }
    if (local_93 != false) {
      if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
        bVar2 = false;
        if ((param[1].field_0.field_3.Type == '\x03') &&
           (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
          bVar2 = param[1].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar2) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_rebels.cpp"
                        ,0x19,"int AF_A_ShootGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        this = (DObject *)param[1].field_0.field_1.a;
        local_96 = true;
        if (this != (DObject *)0x0) {
          local_96 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
        }
        if (local_96 == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_rebels.cpp"
                        ,0x19,"int AF_A_ShootGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if ((numparam < 3) || (param[2].field_0.field_3.Type == 0xff)) {
        pitch.Degrees = 0.0;
      }
      else {
        bVar2 = false;
        if ((param[2].field_0.field_3.Type == '\x03') &&
           (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
          bVar2 = param[2].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar2) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_rebels.cpp"
                        ,0x19,"int AF_A_ShootGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        pitch.Degrees = (double)param[2].field_0.field_1.a;
      }
      TAngle<double>::TAngle(&local_58);
      bVar2 = TObjPtr<AActor>::operator==(&ent->target,(AActor *)0x0);
      if (!bVar2) {
        FSoundID::FSoundID(&local_5c,"monsters/rifle");
        S_Sound(ent,1,&local_5c,1.0,1.0);
        A_FaceTarget(ent);
        TAngle<double>::TAngle((TAngle<double> *)local_70,&(ent->Angles).Yaw);
        TAngle<double>::TAngle(&local_78,0.0);
        P_AimLineAttack((AActor *)(local_70 + 8),(DAngle *)ent,2048.0,
                        (FTranslatedLineTarget *)local_70,(DAngle *)0x0,(int)&local_78,(AActor *)0x0
                        ,(AActor *)0x0);
        TAngle<double>::operator=(&local_58,(TAngle<double> *)(local_70 + 8));
        iVar1 = FRandom::Random2(&pr_shootgun);
        TAngle<double>::operator+(&local_80,(double)iVar1 * 0.0439453125);
        TAngle<double>::TAngle(&local_88,&local_58);
        iVar1 = FRandom::operator()(&pr_shootgun);
        FName::FName(&local_8c,NAME_Hitscan);
        FName::FName(&local_90,NAME_StrifePuff);
        P_LineAttack(ent,&local_80,2048.0,&local_88,(iVar1 % 5 + 1) * 3,&local_8c,&local_90,0,
                     (FTranslatedLineTarget *)0x0,(int *)0x0);
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_rebels.cpp"
                  ,0x19,"int AF_A_ShootGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_rebels.cpp"
                ,0x19,"int AF_A_ShootGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ShootGun)
{
	PARAM_ACTION_PROLOGUE;

	DAngle pitch;

	if (self->target == NULL)
		return 0;

	S_Sound (self, CHAN_WEAPON, "monsters/rifle", 1, ATTN_NORM);
	A_FaceTarget (self);
	pitch = P_AimLineAttack (self, self->Angles.Yaw, MISSILERANGE);
	P_LineAttack (self, self->Angles.Yaw + pr_shootgun.Random2() * (11.25 / 256),
		MISSILERANGE, pitch,
		3*(pr_shootgun() % 5 + 1), NAME_Hitscan, NAME_StrifePuff);
	return 0;
}